

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation
          (Recycler *this,size_t allocSize,void **allocatorAddress,uint32 *endAddressOffset,
          uint32 *freeListOffset,bool allowBumpAllocation,bool isOOPJIT)

{
  uint32 uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  char *pcVar6;
  TBlockAllocatorType *pTVar7;
  
  if (allocSize == 0 || (allocSize & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59a,"(HeapInfo::IsAlignedSize(allocSize))",
                       "HeapInfo::IsAlignedSize(allocSize)");
    if (!bVar3) goto LAB_0067dfac;
    *puVar5 = 0;
  }
  if (0x300 < allocSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59b,"(HeapInfo::IsSmallObject(allocSize))",
                       "HeapInfo::IsSmallObject(allocSize)");
    if (!bVar3) goto LAB_0067dfac;
    *puVar5 = 0;
  }
  pTVar7 = &(this->autoHeap).defaultHeap.heapBuckets[(int)(allocSize >> 4) - 1].heapBucket.
            super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
            .super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>.
            allocatorHead;
  *allocatorAddress = pTVar7;
  *endAddressOffset = 0;
  *freeListOffset = 8;
  if (!isOOPJIT) {
    pcVar6 = GetAddressOfAllocator<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (pTVar7 != (TBlockAllocatorType *)pcVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5a9,"(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize))",
                         "allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize)");
      if (!bVar3) goto LAB_0067dfac;
      *puVar5 = 0;
    }
    uVar1 = *endAddressOffset;
    uVar4 = GetEndAddressOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5aa,"(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize))",
                         "endAddressOffset == GetEndAddressOffset<NoBit>(allocSize)");
      if (!bVar3) goto LAB_0067dfac;
      *puVar5 = 0;
    }
    uVar1 = *freeListOffset;
    uVar4 = GetFreeObjectListOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ab,"(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize))",
                         "freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize)");
      if (!bVar3) goto LAB_0067dfac;
      *puVar5 = 0;
    }
    if ((this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) &&
       (this->verifyEnabled != true)) {
      if (this->isPageHeapEnabled != allowBumpAllocation) goto LAB_0067df82;
    }
    else if (!allowBumpAllocation) goto LAB_0067df88;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5ac,"(allowBumpAllocation == AllowNativeCodeBumpAllocation())",
                       "allowBumpAllocation == AllowNativeCodeBumpAllocation()");
    if (!bVar3) {
LAB_0067dfac:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
LAB_0067df82:
  if (allowBumpAllocation) {
    return;
  }
LAB_0067df88:
  *freeListOffset = *endAddressOffset;
  return;
}

Assistant:

void Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation(size_t allocSize, void*& allocatorAddress, uint32& endAddressOffset, uint32& freeListOffset, bool allowBumpAllocation, bool isOOPJIT)
{
    Assert(HeapInfo::IsAlignedSize(allocSize));
    Assert(HeapInfo::IsSmallObject(allocSize));

    allocatorAddress = (char*)this + offsetof(Recycler, autoHeap)
        + offsetof(HeapInfoManager, defaultHeap)
        + offsetof(HeapInfo, heapBuckets)
        + sizeof(HeapBucketGroup<SmallAllocationBlockAttributes>)*((uint)(allocSize >> HeapConstants::ObjectAllocationShift) - 1)
        + HeapBucketGroup<SmallAllocationBlockAttributes>::GetHeapBucketOffset()
        + HeapBucketT<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetAllocatorHeadOffset();

    endAddressOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetEndAddressOffset();
    freeListOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetFreeObjectListOffset();;

    if (!isOOPJIT)
    {
        Assert(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize));
        Assert(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize));
        Assert(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize));
        Assert(allowBumpAllocation == AllowNativeCodeBumpAllocation());
    }

    if (!allowBumpAllocation)
    {
        freeListOffset = endAddressOffset;
    }
}